

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O1

void __thiscall
Diligent::ShaderResourceCacheVk::InitializeSets
          (ShaderResourceCacheVk *this,IMemoryAllocator *MemAllocator,Uint32 NumSets,
          Uint32 *SetSizes)

{
  void *ptr;
  uint uVar1;
  int iVar2;
  pointer __p;
  ulong uVar3;
  undefined4 extraout_var;
  DescriptorSet *pDVar4;
  char *pcVar5;
  Resource *pRVar6;
  ulong uVar7;
  long lVar8;
  char (*in_R8) [37];
  Resource *pRVar9;
  char *pcVar10;
  string msg;
  Uint32 local_5c;
  string local_58;
  IMemoryAllocator *local_38;
  
  local_5c = NumSets;
  if ((this->m_pMemory)._M_t.
      super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
      super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
      super__Head_base<0UL,_void_*,_false>._M_head_impl != (void *)0x0) {
    FormatString<char[34]>(&local_58,(char (*) [34])"Memory has already been allocated");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"InitializeSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x37);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  this->m_NumSets = (Uint16)local_5c;
  if (0xffff < local_5c) {
    FormatString<char[10],unsigned_int,char[37]>
              (&local_58,(Diligent *)"NumSets (",(char (*) [10])&local_5c,
               (uint *)") exceed maximum representable value",in_R8);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"InitializeSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x44);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  *(uint *)&this->field_0x1c = *(uint *)&this->field_0x1c & 0x80000000;
  pcVar5 = (char *)(ulong)local_5c;
  if (local_5c != 0) {
    pcVar10 = (char *)0x0;
    local_38 = MemAllocator;
    do {
      if (SetSizes[(long)pcVar10] == 0) {
        FormatString<char[26],char[16]>
                  (&local_58,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SetSizes[t] > 0",(char (*) [16])pcVar5);
        DebugAssertionFailed
                  (local_58._M_dataplus._M_p,"InitializeSets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                   ,0x49);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      *(uint *)&this->field_0x1c =
           *(uint *)&this->field_0x1c & 0x80000000 |
           SetSizes[(long)pcVar10] + *(uint *)&this->field_0x1c & 0x7fffffff;
      pcVar10 = pcVar10 + 1;
      pcVar5 = (char *)(ulong)local_5c;
      MemAllocator = local_38;
    } while (pcVar10 < pcVar5);
  }
  uVar7 = (ulong)(*(uint *)&this->field_0x1c & 0x7fffffff) * 0x20;
  uVar3 = 0;
  pcVar10 = pcVar5;
  if ((int)pcVar5 != 0) {
    pcVar10 = (char *)0x0;
    do {
      uVar1 = (int)uVar3 + SetSizes[(long)pcVar10];
      uVar3 = (ulong)uVar1;
      pcVar10 = pcVar10 + 1;
    } while (pcVar5 != pcVar10);
    uVar3 = (ulong)uVar1 << 5;
  }
  if (uVar7 != uVar3) {
    FormatString<char[26],char[55]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"MemorySize == GetRequiredMemorySize(NumSets, SetSizes)",
               (char (*) [55])pcVar10);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"InitializeSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x4e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  lVar8 = uVar7 + (long)pcVar5 * 0x30;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::resize(&this->m_DbgInitializedResources,(ulong)this->m_NumSets);
  if (lVar8 != 0) {
    pcVar5 = 
    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
    ;
    iVar2 = (**MemAllocator->_vptr_IMemoryAllocator)
                      (MemAllocator,lVar8,"Memory for shader resource cache data",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                       ,0x55);
    local_58._M_string_length = 0;
    ptr = (this->m_pMemory)._M_t.
          super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
          super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
          super__Head_base<0UL,_void_*,_false>._M_head_impl;
    (this->m_pMemory)._M_t.
    super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
    super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)CONCAT44(extraout_var,iVar2);
    local_58._M_dataplus._M_p = (pointer)MemAllocator;
    if (ptr != (void *)0x0) {
      STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
                ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&this->m_pMemory,ptr);
    }
    (this->m_pMemory)._M_t.
    super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
    super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>.
    _M_head_impl = (STDDeleter<void,_Diligent::IMemoryAllocator>)local_58._M_dataplus._M_p;
    local_58._M_dataplus._M_p = (Char *)0x0;
    if ((void *)local_58._M_string_length != (void *)0x0) {
      STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
                ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&local_58,
                 (void *)local_58._M_string_length);
    }
    pRVar9 = (Resource *)
             ((ulong)((uint)this->m_NumSets * 0x30) +
             (long)(this->m_pMemory)._M_t.
                   super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                   .super__Head_base<0UL,_void_*,_false>._M_head_impl);
    local_38 = (IMemoryAllocator *)lVar8;
    if (local_5c != 0) {
      lVar8 = 0;
      uVar3 = 0;
      do {
        pDVar4 = GetDescriptorSet(this,(Uint32)uVar3);
        uVar1 = SetSizes[uVar3];
        pcVar5 = (char *)(ulong)uVar1;
        pRVar6 = (Resource *)0x0;
        if (uVar1 != 0) {
          pRVar6 = pRVar9;
        }
        pDVar4->m_NumResources = uVar1;
        pDVar4->m_pResources = pRVar6;
        (pDVar4->m_DescriptorSetAllocation).CmdQueueMask = 0;
        (pDVar4->m_DescriptorSetAllocation).DescrSetAllocator = (DescriptorSetAllocator *)0x0;
        (pDVar4->m_DescriptorSetAllocation).Set = (VkDescriptorSet)0x0;
        (pDVar4->m_DescriptorSetAllocation).Pool = (VkDescriptorPool)0x0;
        pRVar9 = pRVar9 + SetSizes[uVar3];
        std::vector<bool,_std::allocator<bool>_>::resize
                  ((vector<bool,_std::allocator<bool>_> *)
                   ((long)&(((this->m_DbgInitializedResources).
                             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Bvector_base<std::allocator<bool>_>)._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar8),
                   (ulong)SetSizes[uVar3],false);
        uVar3 = uVar3 + 1;
        lVar8 = lVar8 + 0x28;
      } while (uVar3 < local_5c);
    }
    if (pRVar9 != (Resource *)
                  ((long)local_38 +
                  (long)(this->m_pMemory)._M_t.
                        super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                        .super__Head_base<0UL,_void_*,_false>._M_head_impl)) {
      FormatString<char[26],char[58]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"(char*)pCurrResPtr == (char*)m_pMemory.get() + MemorySize",
                 (char (*) [58])pcVar5);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"InitializeSets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,99);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void ShaderResourceCacheVk::InitializeSets(IMemoryAllocator& MemAllocator, Uint32 NumSets, const Uint32* SetSizes)
{
    VERIFY(!m_pMemory, "Memory has already been allocated");

    // Memory layout:
    //
    //  m_pMemory
    //  |
    //  V
    // ||  DescriptorSet[0]  |   ....    |  DescriptorSet[Ns-1]  |  Res[0]  |  ... |  Res[n-1]  |    ....     | Res[0]  |  ... |  Res[m-1]  ||
    //
    //
    //  Ns = m_NumSets

    m_NumSets = static_cast<Uint16>(NumSets);
    VERIFY(m_NumSets == NumSets, "NumSets (", NumSets, ") exceed maximum representable value");

    m_TotalResources = 0;
    for (Uint32 t = 0; t < NumSets; ++t)
    {
        VERIFY_EXPR(SetSizes[t] > 0);
        m_TotalResources += SetSizes[t];
    }

    const size_t MemorySize = NumSets * sizeof(DescriptorSet) + m_TotalResources * sizeof(Resource);
    VERIFY_EXPR(MemorySize == GetRequiredMemorySize(NumSets, SetSizes));
#ifdef DILIGENT_DEBUG
    m_DbgInitializedResources.resize(m_NumSets);
#endif
    if (MemorySize > 0)
    {
        m_pMemory = decltype(m_pMemory){
            ALLOCATE_RAW(MemAllocator, "Memory for shader resource cache data", MemorySize),
            STDDeleter<void, IMemoryAllocator>(MemAllocator) //
        };

        DescriptorSet* pSets       = reinterpret_cast<DescriptorSet*>(m_pMemory.get());
        Resource*      pCurrResPtr = reinterpret_cast<Resource*>(pSets + m_NumSets);
        for (Uint32 t = 0; t < NumSets; ++t)
        {
            new (&GetDescriptorSet(t)) DescriptorSet{SetSizes[t], SetSizes[t] > 0 ? pCurrResPtr : nullptr};
            pCurrResPtr += SetSizes[t];
#ifdef DILIGENT_DEBUG
            m_DbgInitializedResources[t].resize(SetSizes[t]);
#endif
        }
        VERIFY_EXPR((char*)pCurrResPtr == (char*)m_pMemory.get() + MemorySize);
    }
}